

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

line_t_conflict * __thiscall FBlockLinesIterator::Next(FBlockLinesIterator *this)

{
  uint uVar1;
  line_t_conflict **pplVar2;
  int iVar3;
  line_t_conflict *plVar4;
  line_t_conflict *ld_1;
  line_t_conflict *ld;
  FBlockLinesIterator *this_local;
  
LAB_0059bd86:
  do {
    while( true ) {
      while (this->polyLink == (polyblock_t *)0x0) {
        if (this->list != (int *)0x0) {
          while (*this->list != -1) {
            plVar4 = lines + *this->list;
            this->list = this->list + 1;
            if (plVar4->validcount != validcount) {
              plVar4->validcount = validcount;
              return plVar4;
            }
          }
        }
        iVar3 = this->curx + 1;
        this->curx = iVar3;
        if (this->maxx < iVar3) {
          this->curx = this->minx;
          iVar3 = this->cury + 1;
          this->cury = iVar3;
          if (this->maxy < iVar3) {
            return (line_t_conflict *)0x0;
          }
        }
        StartBlock(this,this->curx,this->cury);
      }
      if (this->polyLink->polyobj != (FPolyObj *)0x0) break;
      this->polyLink = this->polyLink->next;
    }
    if (this->polyIndex == 0) {
      if (this->polyLink->polyobj->validcount == validcount) {
        this->polyLink = this->polyLink->next;
        goto LAB_0059bd86;
      }
      this->polyLink->polyobj->validcount = validcount;
    }
    pplVar2 = TArray<line_t_*,_line_t_*>::operator[]
                        (&this->polyLink->polyobj->Linedefs,(long)this->polyIndex);
    plVar4 = *pplVar2;
    iVar3 = this->polyIndex + 1;
    this->polyIndex = iVar3;
    uVar1 = TArray<line_t_*,_line_t_*>::Size(&this->polyLink->polyobj->Linedefs);
    if ((int)uVar1 <= iVar3) {
      this->polyLink = this->polyLink->next;
      this->polyIndex = 0;
    }
    if (plVar4->validcount != validcount) {
      plVar4->validcount = validcount;
      return plVar4;
    }
  } while( true );
}

Assistant:

line_t *FBlockLinesIterator::Next()
{
	while (true)
	{
		while (polyLink != NULL)
		{
			if (polyLink->polyobj)
			{
				if (polyIndex == 0)
				{
					if (polyLink->polyobj->validcount == validcount)
					{
						polyLink = polyLink->next;
						continue;
					}
					polyLink->polyobj->validcount = validcount;
				}

				line_t *ld = polyLink->polyobj->Linedefs[polyIndex];

				if (++polyIndex >= (int)polyLink->polyobj->Linedefs.Size())
				{
					polyLink = polyLink->next;
					polyIndex = 0;
				}

				if (ld->validcount == validcount)
				{
					continue;
				}
				else
				{
					ld->validcount = validcount;
					return ld;
				}
			}
			else polyLink = polyLink->next;
		}

		if (list != NULL)
		{
			while (*list != -1)
			{
				line_t *ld = &lines[*list];

				list++;
				if (ld->validcount != validcount)
				{
					ld->validcount = validcount;
					return ld;
				}
			}
		}

		if (++curx > maxx)
		{
			curx = minx;
			if (++cury > maxy) return NULL;
		}
		StartBlock(curx, cury);
	}
}